

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O0

void __thiscall r_exec::_Mem::pack_hlp(_Mem *this,Code *hlp)

{
  byte bVar1;
  char cVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar8;
  size_type sVar9;
  reference pvVar10;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  int in_ECX;
  void *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar11;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  void *in_R8;
  Atom local_bc [4];
  P<r_code::Code> local_b8;
  ushort local_aa;
  Atom local_a8 [4];
  Atom local_a4 [2];
  uint16_t i_3;
  Atom local_a0 [4];
  Atom local_9c [4];
  Atom local_98 [4];
  undefined4 local_94;
  ushort local_90;
  short local_8e;
  Atom t_atom;
  uint16_t i_2;
  uint16_t inserted_zone_length;
  Code *pattern_object;
  ushort local_78;
  ushort local_76;
  ushort local_74;
  uint16_t i_1;
  uint16_t extent_index;
  uint16_t insertion_point;
  uint16_t pattern_count;
  uint16_t pattern_set_index;
  vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_> references;
  ushort local_4e;
  uint16_t group_count;
  uint16_t group_set_index;
  uint16_t i;
  undefined1 local_38 [6];
  uint16_t trailing_code_index;
  vector<r_code::Atom,_std::allocator<r_code::Atom>_> trailing_code;
  Code *unpacked_hlp;
  Code *hlp_local;
  _Mem *this_local;
  
  iVar5 = clone(this,(__fn *)hlp,in_RDX,in_ECX,in_R8);
  trailing_code.super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar5);
  std::vector<r_code::Atom,_std::allocator<r_code::Atom>_>::vector
            ((vector<r_code::Atom,_std::allocator<r_code::Atom>_> *)local_38);
  (*(hlp->super__Object)._vptr__Object[4])(hlp,3);
  local_4e = r_code::Atom::asIndex();
  while( true ) {
    uVar6 = (*(hlp->super__Object)._vptr__Object[6])();
    if ((uVar6 & 0xffff) <= (uint)local_4e) break;
    iVar5 = (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)local_4e);
    std::vector<r_code::Atom,_std::allocator<r_code::Atom>_>::push_back
              ((vector<r_code::Atom,_std::allocator<r_code::Atom>_> *)local_38,
               (value_type *)CONCAT44(extraout_var_00,iVar5));
    local_4e = local_4e + 1;
  }
  (*(hlp->super__Object)._vptr__Object[4])(hlp,5);
  uVar3 = r_code::Atom::asIndex();
  (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)uVar3);
  bVar1 = r_code::Atom::getAtomCount();
  references.super__Vector_base<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ = (ushort)bVar1;
  std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::vector
            ((vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_> *)&extent_index
            );
  (*(hlp->super__Object)._vptr__Object[4])(hlp,2);
  i_1 = r_code::Atom::asIndex();
  (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)i_1);
  bVar1 = r_code::Atom::getAtomCount();
  local_74 = (ushort)bVar1;
  local_78 = i_1 + local_74 + 1;
  local_76 = local_78;
  for (pattern_object._6_2_ = 0; pattern_object._6_2_ < local_74;
      pattern_object._6_2_ = pattern_object._6_2_ + 1) {
    iVar5 = (*(hlp->super__Object)._vptr__Object[9])(hlp,(ulong)pattern_object._6_2_);
    r_code::Atom::IPointer((ushort)&t_atom);
    uVar6 = i_1 + 1 + (uint)pattern_object._6_2_;
    iVar7 = (*(hlp->super__Object)._vptr__Object[4])
                      (hlp,(ulong)(ushort)uVar6,(ulong)i_1,(ulong)uVar6);
    r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar7),&t_atom);
    r_code::Atom::~Atom(&t_atom);
    pack_fact(this,(Code *)CONCAT44(extraout_var_01,iVar5),hlp,&local_78,
              (vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_> *)
              &extent_index);
  }
  local_8e = local_78 - local_76;
  local_90 = 0;
  while( true ) {
    uVar8 = (ulong)local_90;
    sVar9 = std::vector<r_code::Atom,_std::allocator<r_code::Atom>_>::size
                      ((vector<r_code::Atom,_std::allocator<r_code::Atom>_> *)local_38);
    if (sVar9 <= uVar8) break;
    pvVar10 = std::vector<r_code::Atom,_std::allocator<r_code::Atom>_>::operator[]
                        ((vector<r_code::Atom,_std::allocator<r_code::Atom>_> *)local_38,
                         (ulong)local_90);
    local_94 = *(undefined4 *)pvVar10;
    cVar2 = r_code::Atom::getDescriptor();
    if (cVar2 == -0x7c) {
      r_code::Atom::asIndex();
      r_code::Atom::IPointer((ushort)local_98);
      iVar5 = (*(hlp->super__Object)._vptr__Object[4])
                        (hlp,(ulong)(ushort)((uint)local_90 + (uint)local_78),extraout_RDX_00,
                         (ulong)((uint)local_90 + (uint)local_78));
      r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar5),local_98);
      r_code::Atom::~Atom(local_98);
    }
    else if (cVar2 == -0x73) {
      bVar1 = r_code::Atom::asAssignmentIndex();
      r_code::Atom::asIndex();
      r_code::Atom::AssignmentPointer((uchar)local_9c,(ushort)bVar1);
      iVar5 = (*(hlp->super__Object)._vptr__Object[4])
                        (hlp,(ulong)(ushort)((uint)local_90 + (uint)local_78),extraout_RDX_01,
                         (ulong)((uint)local_90 + (uint)local_78));
      r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar5),local_9c);
      r_code::Atom::~Atom(local_9c);
    }
    else {
      iVar5 = (*(hlp->super__Object)._vptr__Object[4])
                        (hlp,(ulong)(ushort)((uint)local_90 + (uint)local_78),extraout_RDX,
                         (ulong)((uint)local_90 + (uint)local_78));
      r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar5),(Atom *)&local_94);
    }
    r_code::Atom::~Atom((Atom *)&local_94);
    local_90 = local_90 + 1;
  }
  (*(hlp->super__Object)._vptr__Object[4])(hlp,3);
  r_code::Atom::asIndex();
  r_code::Atom::IPointer((ushort)local_a0);
  iVar5 = (*(hlp->super__Object)._vptr__Object[4])(hlp,3);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_06,iVar5),local_a0);
  r_code::Atom::~Atom(local_a0);
  (*(hlp->super__Object)._vptr__Object[4])(hlp,4);
  r_code::Atom::asIndex();
  r_code::Atom::IPointer((ushort)local_a4);
  iVar5 = (*(hlp->super__Object)._vptr__Object[4])(hlp,4);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_07,iVar5),local_a4);
  r_code::Atom::~Atom(local_a4);
  (*(hlp->super__Object)._vptr__Object[4])(hlp,5);
  r_code::Atom::asIndex();
  r_code::Atom::IPointer((ushort)local_a8);
  iVar5 = (*(hlp->super__Object)._vptr__Object[4])(hlp,5);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_08,iVar5),local_a8);
  r_code::Atom::~Atom(local_a8);
  uVar3 = uVar3 + local_8e;
  uVar11 = extraout_RDX_02;
  for (local_aa = 1;
      local_aa <=
      references.super__Vector_base<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_; local_aa = local_aa + 1) {
    uVar6 = (uint)uVar3 + (uint)local_aa;
    uVar8 = (ulong)uVar6;
    (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)(ushort)uVar6,uVar11,uVar8);
    uVar4 = r_code::Atom::asIndex();
    iVar5 = (*(hlp->super__Object)._vptr__Object[9])
                      (hlp,(ulong)uVar4,extraout_RDX_03,CONCAT62((int6)(uVar8 >> 0x10),uVar4));
    core::P<r_code::Code>::P(&local_b8,(Code *)CONCAT44(extraout_var_09,iVar5));
    std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::push_back
              ((vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_> *)
               &extent_index,&local_b8);
    core::P<r_code::Code>::~P(&local_b8);
    std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::size
              ((vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_> *)
               &extent_index);
    r_code::Atom::RPointer((ushort)local_bc);
    uVar6 = (uint)uVar3 + (uint)local_aa;
    iVar5 = (*(hlp->super__Object)._vptr__Object[4])
                      (hlp,(ulong)(ushort)uVar6,extraout_RDX_04,(ulong)uVar6);
    r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_10,iVar5),local_bc);
    r_code::Atom::~Atom(local_bc);
    uVar11 = extraout_RDX_05;
  }
  (*(hlp->super__Object)._vptr__Object[0xc])(hlp,&extent_index);
  (*(hlp->super__Object)._vptr__Object[0x19])
            (hlp,trailing_code.super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::~vector
            ((vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_> *)&extent_index
            );
  std::vector<r_code::Atom,_std::allocator<r_code::Atom>_>::~vector
            ((vector<r_code::Atom,_std::allocator<r_code::Atom>_> *)local_38);
  return;
}

Assistant:

void _Mem::pack_hlp(Code *hlp) const   // produces a new object where a set of pattern objects is transformed into a packed set of pattern code.
{
    Code *unpacked_hlp = clone(hlp);
    std::vector<Atom> trailing_code; // copy of the original code (the latter will be overwritten by packed facts).
    uint16_t trailing_code_index = hlp->code(HLP_FWD_GUARDS).asIndex();

    for (uint16_t i = trailing_code_index; i < hlp->code_size(); ++i) {
        trailing_code.push_back(hlp->code(i));
    }

    uint16_t group_set_index = hlp->code(HLP_OUT_GRPS).asIndex();
    uint16_t group_count = hlp->code(group_set_index).getAtomCount();
    std::vector<P<Code> > references;
    uint16_t pattern_set_index = hlp->code(HLP_OBJS).asIndex();
    uint16_t pattern_count = hlp->code(pattern_set_index).getAtomCount();
    uint16_t insertion_point = pattern_set_index + pattern_count + 1; // point from where compacted code is to be inserted.
    uint16_t extent_index = insertion_point;

    for (uint16_t i = 0; i < pattern_count; ++i) {
        Code *pattern_object = hlp->get_reference(i);
        hlp->code(pattern_set_index + i + 1) = Atom::IPointer(extent_index);
        pack_fact(pattern_object, hlp, extent_index, &references);
    }

    uint16_t inserted_zone_length = extent_index - insertion_point;

    for (uint16_t i = 0; i < trailing_code.size(); ++i) { // shift the trailing code downward; adjust i-ptrs.
        Atom t_atom = trailing_code[i];

        switch (t_atom.getDescriptor()) {
        case Atom::I_PTR:
            hlp->code(i + extent_index) = Atom::IPointer(t_atom.asIndex() + inserted_zone_length);
            break;

        case Atom::ASSIGN_PTR:
            hlp->code(i + extent_index) = Atom::AssignmentPointer(t_atom.asAssignmentIndex(), t_atom.asIndex() + inserted_zone_length);
            break;

        default:
            hlp->code(i + extent_index) = t_atom;
            break;
        }
    }

    // adjust set indices.
    hlp->code(CST_FWD_GUARDS) = Atom::IPointer(hlp->code(HLP_FWD_GUARDS).asIndex() + inserted_zone_length);
    hlp->code(CST_BWD_GUARDS) = Atom::IPointer(hlp->code(HLP_BWD_GUARDS).asIndex() + inserted_zone_length);
    hlp->code(CST_OUT_GRPS) = Atom::IPointer(hlp->code(HLP_OUT_GRPS).asIndex() + inserted_zone_length);
    group_set_index += inserted_zone_length;

    for (uint16_t i = 1; i <= group_count; ++i) { // append the out_groups to the new references; adjust the exisitng r-ptrs.
        references.push_back(hlp->get_reference(hlp->code(group_set_index + i).asIndex()));
        hlp->code(group_set_index + i) = Atom::RPointer(references.size() - 1);
    }

    hlp->set_references(references);
    hlp->add_reference(unpacked_hlp); // hidden reference.
}